

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_get_forward_list_Test::~ObjectTest_basic_get_forward_list_Test
          (ObjectTest_basic_get_forward_list_Test *this)

{
  ObjectTest_basic_get_forward_list_Test *this_local;
  
  ~ObjectTest_basic_get_forward_list_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_forward_list) {
	object obj;

	EXPECT_TRUE(obj.get<std::forward_list<bool>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<short>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<int>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<float>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<object>>().empty());
}